

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O2

void __thiscall
leveldb::_Test_ConsumeDecimalNumberRoundtripWithPadding::_Run
          (_Test_ConsumeDecimalNumberRoundtripWithPadding *this)

{
  uint64_t number;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  ConsumeDecimalNumberRoundtripTest(0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"abc",&local_41);
  ConsumeDecimalNumberRoundtripTest(1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"x",&local_41);
  ConsumeDecimalNumberRoundtripTest(9,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"_",&local_41);
  ConsumeDecimalNumberRoundtripTest(10,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40.field_2._M_allocated_capacity._0_4_ = 0;
  local_40._M_string_length = 3;
  ConsumeDecimalNumberRoundtripTest(0xb,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"abc",&local_41);
  ConsumeDecimalNumberRoundtripTest(0x13,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"padding",&local_41);
  ConsumeDecimalNumberRoundtripTest(99,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  ConsumeDecimalNumberRoundtripTest(100,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  for (number = 0xffffffffffffffff; number != 0xffffffffffffff9b; number = number - 1) {
    std::__cxx11::string::string((string *)&local_40,"pad",&local_41);
    ConsumeDecimalNumberRoundtripTest(number,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberRoundtripWithPadding) {
  ConsumeDecimalNumberRoundtripTest(0, " ");
  ConsumeDecimalNumberRoundtripTest(1, "abc");
  ConsumeDecimalNumberRoundtripTest(9, "x");

  ConsumeDecimalNumberRoundtripTest(10, "_");
  ConsumeDecimalNumberRoundtripTest(11, std::string("\0\0\0", 3));
  ConsumeDecimalNumberRoundtripTest(19, "abc");
  ConsumeDecimalNumberRoundtripTest(99, "padding");

  ConsumeDecimalNumberRoundtripTest(100, " ");

  for (uint64_t i = 0; i < 100; ++i) {
    uint64_t large_number = std::numeric_limits<uint64_t>::max() - i;
    ConsumeDecimalNumberRoundtripTest(large_number, "pad");
  }
}